

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

LogHelper * util::operator<<(LogHelper *h,CylHead *t)

{
  if (h->clearline == true) {
    h->clearline = false;
    operator<<(h,clearline);
  }
  ::operator<<(h->screen,t);
  if ((h->file != (ostream *)0x0) && (h->statusmsg == false)) {
    ::operator<<(h->file,t);
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, const T& t)
{
    if (h.clearline)
    {
        h.clearline = false;
        h << ttycmd::clearline;
    }

    *h.screen << t;
    if (h.file && !h.statusmsg) *h.file << t;
    return h;
}